

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::peer_connection::peer_log
          (peer_connection *this,direction_t direction,char *event,char *fmt,...)

{
  _Atomic_word *p_Var1;
  int *piVar2;
  int iVar3;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  undefined8 uVar5;
  char in_AL;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 in_R8;
  undefined8 in_R9;
  bool bVar7;
  uint in_XMM0_Da;
  uint in_XMM1_Da;
  undefined8 in_XMM2_Qa;
  element_type *in_XMM3_Qa;
  duration in_XMM4_Qa;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_XMM5_Qa;
  int64_t in_XMM6_Qa;
  disk_interface *in_XMM7_Qa;
  direction_t direction_local;
  torrent_handle local_118;
  undefined1 local_108 [16];
  char *fmt_local;
  char *event_local;
  va_list v;
  undefined1 local_c8 [32];
  peer_class_set local_a8;
  element_type *local_68;
  time_point local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  int64_t local_38;
  disk_interface *local_28;
  
  if (in_AL != '\0') {
    local_a8.m_class.
    super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
    ._M_elems[3].m_val = in_XMM0_Da;
    local_a8.m_class.
    super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
    ._M_elems[7].m_val = in_XMM1_Da;
    local_a8.m_class.
    super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
    ._M_elems._44_8_ = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58.__d.__r = (duration)(duration)in_XMM4_Qa.__r;
    local_48._M_pi = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  direction_local = direction;
  fmt_local = fmt;
  event_local = event;
  local_a8._0_8_ = in_R8;
  local_a8.m_class.
  super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
  ._M_elems._4_8_ = in_R9;
  iVar6 = (*(((this->super_peer_connection_hot_members).m_ses)->super_session_logger).
            _vptr_session_logger[5])();
  if ((short)*(undefined4 *)(CONCAT44(extraout_var,iVar6) + 0x68) < 0) {
    v[0].reg_save_area = local_c8;
    v[0].overflow_arg_area = &stack0x00000008;
    v[0].gp_offset = 0x20;
    v[0].fp_offset = 0x30;
    local_118.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_118.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (this->super_peer_connection_hot_members).m_torrent.
              super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_0023acd0:
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      iVar6 = this_00->_M_use_count;
      do {
        if (iVar6 == 0) goto LAB_0023acd0;
        LOCK();
        iVar3 = this_00->_M_use_count;
        bVar7 = iVar6 == iVar3;
        if (bVar7) {
          this_00->_M_use_count = iVar6 + 1;
          iVar3 = iVar6;
        }
        iVar6 = iVar3;
        UNLOCK();
      } while (!bVar7);
      if ((this->super_peer_connection_hot_members).m_torrent.
          super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0 && this_00->_M_use_count != 0) {
        torrent::get_handle((torrent *)local_108);
        uVar5 = local_108._8_8_;
        local_118.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)local_108._0_8_;
        _Var4._M_pi = local_118.m_torrent.
                      super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        local_108._0_8_ = (_func_int **)0x0;
        local_108._8_8_ =
             (_Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
              )0x0;
        local_118.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5;
        if ((piece_picker *)_Var4._M_pi != (piece_picker *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var1 = &(_Var4._M_pi)->_M_weak_count;
            iVar6 = *p_Var1;
            *p_Var1 = *p_Var1 + -1;
            UNLOCK();
          }
          else {
            iVar6 = (_Var4._M_pi)->_M_weak_count;
            (_Var4._M_pi)->_M_weak_count = iVar6 + -1;
          }
          if (iVar6 == 1) {
            (*(code *)(((vector<piece_pos,_piece_index_t> *)&(_Var4._M_pi)->_vptr__Sp_counted_base)
                      ->
                      super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                      ).
                      super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                      ._M_impl.super__Vector_impl_data._M_start[3])();
          }
        }
        if ((_Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>)local_108._8_8_ !=
            (_Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            piVar2 = (int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_108._8_8_)->
                                    super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                    ).
                                    super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + 4);
            iVar6 = *piVar2;
            *piVar2 = *piVar2 + -1;
            UNLOCK();
          }
          else {
            iVar6 = *(int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_108._8_8_)->
                                    super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                    ).
                                    super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + 4);
            *(int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_108._8_8_)->
                            super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                            ).
                            super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                            ._M_impl.super__Vector_impl_data._M_finish + 4) = iVar6 + -1;
          }
          if (iVar6 == 1) {
            (*(code *)(((vector<piece_pos,_piece_index_t> *)local_108._8_8_)->
                      super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                      ).
                      super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                      ._M_impl.super__Vector_impl_data._M_start[3])();
          }
        }
      }
    }
    iVar6 = (*(((this->super_peer_connection_hot_members).m_ses)->super_session_logger).
              _vptr_session_logger[5])();
    alert_manager::
    emplace_alert<libtorrent::peer_log_alert,libtorrent::torrent_handle&,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,libtorrent::digest32<160l>const&,libtorrent::peer_log_alert::direction_t&,char_const*&,char_const*&,__va_list_tag(&)[1]>
              ((alert_manager *)CONCAT44(extraout_var_00,iVar6),&local_118,&this->m_remote,
               &this->m_peer_id,&direction_local,&event_local,&fmt_local,&v);
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if ((piece_picker *)
        local_118.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (piece_picker *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &(local_118.m_torrent.
                   super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_weak_count;
        iVar6 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar6 = (local_118.m_torrent.
                 super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi)->_M_weak_count;
        (local_118.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_weak_count = iVar6 + -1;
      }
      if (iVar6 == 1) {
        (*(code *)(((vector<piece_pos,_piece_index_t> *)
                   &(local_118.m_torrent.
                     super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_vptr__Sp_counted_base)->
                  super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                  ).
                  super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                  ._M_impl.super__Vector_impl_data._M_start[3])();
      }
    }
  }
  return;
}

Assistant:

void peer_connection::peer_log(peer_log_alert::direction_t direction
		, char const* event, char const* fmt, ...) const noexcept try
	{
		TORRENT_ASSERT(is_single_thread());

		if (!m_ses.alerts().should_post<peer_log_alert>()) return;

		va_list v;
		va_start(v, fmt);

		torrent_handle h;
		auto t = m_torrent.lock();
		if (t) h = t->get_handle();

		m_ses.alerts().emplace_alert<peer_log_alert>(
			h, m_remote, m_peer_id, direction, event, fmt, v);

		va_end(v);

	}
	catch (std::exception const&) {}